

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputPtr xmlCheckHTTPInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr ret)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlCharEncodingHandlerPtr handler_00;
  xmlCharEncodingHandlerPtr handler;
  int code;
  char *mime;
  char *redir;
  char *encoding;
  xmlParserInputPtr ret_local;
  xmlParserCtxtPtr ctxt_local;
  
  encoding = (char *)ret;
  if ((((ret != (xmlParserInputPtr)0x0) && (ret->buf != (xmlParserInputBufferPtr)0x0)) &&
      (ret->buf->readcallback == xmlIOHTTPRead)) && (ret->buf->context != (void *)0x0)) {
    iVar1 = xmlNanoHTTPReturnCode(ret->buf->context);
    if (iVar1 < 400) {
      pxVar2 = (xmlChar *)xmlNanoHTTPMimeType(ret->buf->context);
      pxVar3 = xmlStrstr(pxVar2,"/xml");
      if (((pxVar3 != (xmlChar *)0x0) ||
          (pxVar2 = xmlStrstr(pxVar2,(xmlChar *)"+xml"), pxVar2 != (xmlChar *)0x0)) &&
         (pxVar2 = (xmlChar *)xmlNanoHTTPEncoding(ret->buf->context), pxVar2 != (xmlChar *)0x0)) {
        handler_00 = xmlFindCharEncodingHandler((char *)pxVar2);
        if (handler_00 == (xmlCharEncodingHandlerPtr)0x0) {
          __xmlErrEncoding(ctxt,XML_ERR_UNKNOWN_ENCODING,"Unknown encoding %s",pxVar2,(xmlChar *)0x0
                          );
        }
        else {
          xmlSwitchInputEncoding(ctxt,ret,handler_00);
        }
        if (ret->encoding == (xmlChar *)0x0) {
          pxVar2 = xmlStrdup(pxVar2);
          ret->encoding = pxVar2;
        }
      }
      pxVar2 = (xmlChar *)xmlNanoHTTPRedir(ret->buf->context);
      if (pxVar2 != (xmlChar *)0x0) {
        if (ret->filename != (char *)0x0) {
          (*xmlFree)(ret->filename);
        }
        if (ret->directory != (char *)0x0) {
          (*xmlFree)(ret->directory);
          ret->directory = (char *)0x0;
        }
        pxVar2 = xmlStrdup(pxVar2);
        ret->filename = (char *)pxVar2;
      }
    }
    else {
      if (ret->filename == (char *)0x0) {
        __xmlLoaderErr(ctxt,"failed to load HTTP resource\n",(char *)0x0);
      }
      else {
        __xmlLoaderErr(ctxt,"failed to load HTTP resource \"%s\"\n",ret->filename);
      }
      xmlFreeInputStream(ret);
      encoding = (char *)0x0;
    }
  }
  return (xmlParserInputPtr)encoding;
}

Assistant:

xmlParserInputPtr
xmlCheckHTTPInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr ret) {
    /* Avoid unused variable warning if features are disabled. */
    (void) ctxt;

#ifdef LIBXML_HTTP_ENABLED
    if ((ret != NULL) && (ret->buf != NULL) &&
        (ret->buf->readcallback == xmlIOHTTPRead) &&
        (ret->buf->context != NULL)) {
        const char *encoding;
        const char *redir;
        const char *mime;
        int code;

        code = xmlNanoHTTPReturnCode(ret->buf->context);
        if (code >= 400) {
            /* fatal error */
	    if (ret->filename != NULL)
		__xmlLoaderErr(ctxt, "failed to load HTTP resource \"%s\"\n",
                         (const char *) ret->filename);
	    else
		__xmlLoaderErr(ctxt, "failed to load HTTP resource\n", NULL);
            xmlFreeInputStream(ret);
            ret = NULL;
        } else {

            mime = xmlNanoHTTPMimeType(ret->buf->context);
            if ((xmlStrstr(BAD_CAST mime, BAD_CAST "/xml")) ||
                (xmlStrstr(BAD_CAST mime, BAD_CAST "+xml"))) {
                encoding = xmlNanoHTTPEncoding(ret->buf->context);
                if (encoding != NULL) {
                    xmlCharEncodingHandlerPtr handler;

                    handler = xmlFindCharEncodingHandler(encoding);
                    if (handler != NULL) {
                        xmlSwitchInputEncoding(ctxt, ret, handler);
                    } else {
                        __xmlErrEncoding(ctxt, XML_ERR_UNKNOWN_ENCODING,
                                         "Unknown encoding %s",
                                         BAD_CAST encoding, NULL);
                    }
                    if (ret->encoding == NULL)
                        ret->encoding = xmlStrdup(BAD_CAST encoding);
                }
#if 0
            } else if (xmlStrstr(BAD_CAST mime, BAD_CAST "html")) {
#endif
            }
            redir = xmlNanoHTTPRedir(ret->buf->context);
            if (redir != NULL) {
                if (ret->filename != NULL)
                    xmlFree((xmlChar *) ret->filename);
                if (ret->directory != NULL) {
                    xmlFree((xmlChar *) ret->directory);
                    ret->directory = NULL;
                }
                ret->filename =
                    (char *) xmlStrdup((const xmlChar *) redir);
            }
        }
    }
#endif
    return(ret);
}